

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O2

uint32_t hash_16_128(uint64_t seed,char *str,uint32_t len)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = 0;
  uVar1 = crc32(0,(uint)seed ^ len);
  uVar3 = (ulong)uVar1;
  lVar5 = 0;
  for (; uVar7 < len - 0x10; uVar7 = uVar7 + 0x10) {
    lVar8 = crc32(uVar3,*(undefined8 *)(str + uVar7));
    uVar3 = uVar3 + lVar8;
    lVar8 = crc32(lVar5,*(undefined8 *)(str + uVar7 + 8));
    lVar5 = lVar5 + lVar8;
  }
  uVar4 = crc32(uVar3,*(undefined8 *)(str + ((ulong)len - 0x10)));
  uVar6 = crc32(lVar5,*(undefined8 *)(str + ((ulong)len - 8)));
  uVar2 = crc32((int)uVar4,(int)uVar6);
  return uVar2;
}

Assistant:

static uint32_t hash_16_128(uint64_t seed, const char* str,
				   uint32_t len)
{
  uint64_t h1, h2;
  uint32_t i;

  h1 = lj_crc32_u32(0, len ^ seed);
  h2 = 0;

  for (i = 0; i < len - 16; i += 16) {
    h1 += lj_crc32_u64(h1, *cast_uint64p(str + i));
    h2 += lj_crc32_u64(h2, *cast_uint64p(str + i + 8));
  };

  h1 = lj_crc32_u64(h1, *cast_uint64p(str + len - 16));
  h2 = lj_crc32_u64(h2, *cast_uint64p(str + len - 8));

  return lj_crc32_u32(h1, h2);
}